

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score_test.cc
# Opt level: O2

void __thiscall xLearn::FMScoreTest_calc_score_Test::TestBody(FMScoreTest_calc_score_Test *this)

{
  uint uVar1;
  index_t iVar2;
  real_t *prVar3;
  index_t i;
  ulong uVar4;
  long lVar5;
  int iVar6;
  index_t j;
  index_t iVar7;
  char *message;
  index_t d;
  index_t iVar8;
  uint uVar9;
  bool bVar10;
  real_t expected;
  undefined1 auVar11 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  AssertionResult gtest_ar;
  AssertHelper local_350;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  SparseRow row;
  Model model;
  FMScore score;
  HyperParam local_240;
  undefined1 auVar12 [64];
  
  for (iVar2 = 1; iVar2 != 100; iVar2 = iVar2 + 1) {
    HyperParam::HyperParam(&local_240);
    local_240._148_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3dcccccd),0));
    std::__cxx11::string::assign((char *)&local_240.loss_func);
    std::__cxx11::string::assign((char *)&local_240.score_func);
    auVar12._8_56_ = extraout_var;
    auVar12._0_8_ = extraout_XMM1_Qa;
    auVar11 = auVar12._0_16_;
    local_240.num_feature = 3;
    local_240.num_K = iVar2;
    local_240.num_field = local_240.num_feature;
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::vector
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
               &row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>,3,
               (allocator_type *)&model);
    prVar3 = &(row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->feat_val;
    for (uVar4 = 0; local_240.num_feature != uVar4; uVar4 = uVar4 + 1) {
      prVar3[-1] = (real_t)(index_t)uVar4;
      *prVar3 = 2.0;
      prVar3 = prVar3 + 3;
    }
    model.score_func_._M_dataplus._M_p = (pointer)&model.score_func_.field_2;
    model.loss_func_._M_dataplus._M_p = (pointer)&model.loss_func_.field_2;
    model.score_func_._M_string_length = 0;
    model.score_func_.field_2._M_local_buf[0] = '\0';
    model.loss_func_._M_string_length = 0;
    model.loss_func_.field_2._M_local_buf[0] = '\0';
    model.param_best_v_ = (real_t *)0x0;
    model.param_best_b_ = (real_t *)0x0;
    model.param_w_ = (real_t *)0x0;
    model.param_v_ = (real_t *)0x0;
    model.param_b_ = (real_t *)0x0;
    model.param_best_w_ = (real_t *)0x0;
    Model::Initialize(&model,&local_240.score_func,&local_240.loss_func,local_240.num_feature,
                      local_240.num_field,local_240.num_K,2,1.0);
    for (uVar4 = 0; model.param_num_w_ != uVar4; uVar4 = uVar4 + 1) {
      model.param_w_[uVar4] = 1.0;
    }
    iVar7 = 0;
    auVar11 = vcvtusi2ss_avx512f(auVar11,model.num_K_);
    auVar11 = ZEXT416((uint)(auVar11._0_4_ * 0.25));
    auVar11 = vroundss_avx(auVar11,auVar11,10);
    iVar6 = vcvttss2usi_avx512f(auVar11);
    prVar3 = model.param_v_;
    for (; iVar8 = model.num_K_, iVar7 != model.num_feat_; iVar7 = iVar7 + 1) {
      while (bVar10 = iVar8 != 0, iVar8 = iVar8 - 1, uVar9 = model.num_K_, bVar10) {
        *prVar3 = 1.0;
        prVar3 = prVar3 + 1;
      }
      for (; uVar1 = iVar6 * 4, uVar9 < (uint)(iVar6 * 4); uVar9 = uVar9 + 1) {
        *prVar3 = 0.0;
        prVar3 = prVar3 + 1;
      }
      for (; uVar1 < (uint)(iVar6 << 3); uVar1 = uVar1 + 1) {
        *prVar3 = 1.0;
        prVar3 = prVar3 + 1;
      }
    }
    score.super_Score.opt_type_._M_dataplus._M_p = (pointer)&score.super_Score.opt_type_.field_2;
    score._64_16_ = ZEXT816(0) << 0x20;
    *model.param_b_ = 0.0;
    score.super_Score.opt_type_._M_string_length = 0;
    score.super_Score.opt_type_.field_2._M_local_buf[0] = '\0';
    score.super_Score._vptr_Score = (_func_int **)&PTR__Score_0014a458;
    score.comp_z_gt_zero = (real_t *)0x0;
    lVar5 = 10;
    while (bVar10 = lVar5 != 0, lVar5 = lVar5 + -1, bVar10) {
      expected = FMScore::CalcScore(&score,(SparseRow *)
                                           &row.
                                            super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>
                                    ,&model,1.0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"val","6+k*4*3",expected,(float)(int)(iVar2 * 0xc + 6));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_348);
        message = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_350,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/score/fm_score_test.cc"
                   ,0x4a,message);
        testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_348);
        testing::internal::AssertHelper::~AssertHelper(&local_350);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_348);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    Score::~Score(&score.super_Score);
    Model::~Model(&model);
    std::_Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>::~_Vector_base
              (&row.super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>);
    HyperParam::~HyperParam(&local_240);
  }
  return;
}

Assistant:

TEST(FMScoreTest, calc_score) {
  for (index_t k = 1; k < 100; ++k) {
    // Init hyper_param
    HyperParam param;
    param.learning_rate = 0.1;
    param.regu_lambda = 0;
    param.loss_func = "squared";
    param.score_func = "fm";
    param.num_feature = 3;
    param.num_K = k;
    param.num_field = 3;
    // Init SparseRow
    SparseRow row(param.num_feature);
    for (index_t i = 0; i < param.num_feature; ++i) {
      row[i].feat_id = i;
      row[i].feat_val = 2.0;
    }
    // Init model
    Model model;
    model.Initialize(param.score_func,
                param.loss_func,
                param.num_feature,
                param.num_field,
                param.num_K, 2);
    real_t* w = model.GetParameter_w();
    index_t num_w = model.GetNumParameter_w();
    for (index_t i = 0; i < num_w; ++i) {
      w[i] = 1.0;
    }
    real_t* v = model.GetParameter_v();
    index_t k_aligned = model.get_aligned_k();
    for (index_t j = 0; j < model.GetNumFeature(); ++j) {
      for(index_t d = 0; d < model.GetNumK(); d++, v++)
        *v = 1.0;
      for(index_t d = model.GetNumK(); d < k_aligned; d++, v++)
        *v = 0;
      for(index_t d = k_aligned; d < 2*k_aligned; d++, v++)
        *v = 1.0;
    }
    model.GetParameter_b()[0] = 0.0;
    FMScore score;
    for (size_t i = 0; i < 10; ++i) {
      real_t val = score.CalcScore(&row, model);
      EXPECT_FLOAT_EQ(val, 6+k*4*3);
    }
  }
}